

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

Reals Omega_h::diffuse_integrals_weighted
                (Mesh *mesh,Graph *g,Reals *error_integrals,Reals *quantity_integrals,
                VarCompareOpts opts,string *name,bool verbose)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  void **ppvVar3;
  int *piVar4;
  element_type *peVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  element_type *peVar8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  shared_ptr<const_Omega_h::TagBase> *psVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  undefined4 uVar13;
  uint uVar14;
  char cVar15;
  LO b;
  uint ncomps;
  uint uVar16;
  I32 IVar17;
  Alloc *pAVar18;
  undefined8 *puVar19;
  undefined8 extraout_RAX;
  undefined7 uVar22;
  undefined7 extraout_var;
  ostream *poVar20;
  Alloc *pAVar21;
  undefined7 extraout_var_00;
  Alloc *extraout_RAX_00;
  ulong uVar23;
  Reals *extraout_RDX;
  Reals *extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  Reals *extraout_RDX_07;
  Reals *extraout_RDX_08;
  int iVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  undefined7 in_register_00000089;
  uint __len;
  uint __val;
  size_t sVar26;
  Comm *pCVar27;
  bool bVar28;
  bool bVar29;
  Reals RVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> comp_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Read<double> comp_integrals;
  Read<double> weighted_sizes;
  Write<double> out;
  Read<double> comp_quantity_integrals;
  Reals weighted_densities;
  string __str_1;
  string local_298;
  undefined1 local_278 [32];
  shared_ptr<const_Omega_h::TagBase> local_258;
  Comm *local_248;
  element_type *peStack_240;
  undefined1 local_238 [16];
  Write<double> local_228;
  shared_ptr<const_Omega_h::TagBase> local_210;
  shared_ptr<const_Omega_h::TagBase> *local_200;
  shared_ptr<const_Omega_h::TagBase> *local_1f8;
  undefined1 local_1f0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  element_type *local_1d8;
  undefined1 local_1d0 [56];
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  element_type *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  element_type *local_168;
  Read<double> local_160;
  Read<double> local_150;
  Write<double> local_140;
  Read<double> local_130;
  Write<double> local_120;
  Reals local_110;
  Read<double> local_100;
  Read<double> local_f0;
  Comm *local_e0;
  element_type *local_d8;
  Reals local_d0;
  Reals local_c0;
  Read<double> local_b0;
  string local_a0;
  Alloc *local_80;
  Alloc *local_78;
  Reals local_70;
  Reals local_60;
  Write<double> local_50;
  Read<double> local_40;
  
  local_168 = (element_type *)CONCAT71(in_register_00000089,verbose);
  pAVar21 = (quantity_integrals->write_).shared_alloc_.alloc;
  if (opts.type == NONE) {
    *(Alloc **)mesh = pAVar21;
    peVar5 = (element_type *)(quantity_integrals->write_).shared_alloc_.direct_ptr;
    (mesh->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    pAVar18 = (Alloc *)CONCAT71((int7)((ulong)peVar5 >> 8),pAVar21 == (Alloc *)0x0);
    if ((((ulong)pAVar21 & 7) == 0 && pAVar21 != (Alloc *)0x0) &&
       (pAVar18 = (Alloc *)&entering_parallel, entering_parallel == '\x01')) {
      pAVar21->use_count = pAVar21->use_count + -1;
      pAVar18 = (Alloc *)(pAVar21->size * 8 + 1);
      *(Alloc **)mesh = pAVar18;
    }
    (quantity_integrals->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (quantity_integrals->write_).shared_alloc_.direct_ptr = (void *)0x0;
  }
  else {
    if (((ulong)pAVar21 & 1) == 0) {
      sVar26 = pAVar21->size;
    }
    else {
      sVar26 = (ulong)pAVar21 >> 3;
    }
    local_1d0._24_8_ = g;
    b = Graph::nnodes((Graph *)error_integrals);
    ncomps = divide_no_remainder<int>((int)(sVar26 >> 3),b);
    local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mesh;
    if ((int)ncomps < 2) {
      local_40.write_.shared_alloc_.alloc = (Alloc *)(name->_M_dataplus)._M_p;
      if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.write_.shared_alloc_.alloc =
               (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_40.write_.shared_alloc_.alloc)->use_count =
               (local_40.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_40.write_.shared_alloc_.direct_ptr = (void *)name->_M_string_length;
      local_178 = (element_type *)local_238;
      fabs_each((Omega_h *)local_178,&local_40);
      pAVar21 = local_40.write_.shared_alloc_.alloc;
      if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
          local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_40.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
          operator_delete(pAVar21,0x48);
        }
      }
      local_b0.write_.shared_alloc_.alloc = (Alloc *)local_238._0_8_;
      if ((local_238._0_8_ & 7) == 0 && (Alloc *)local_238._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_b0.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_238._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_238._0_8_ + 0x30) = *(int *)(local_238._0_8_ + 0x30) + 1;
        }
      }
      local_b0.write_.shared_alloc_.direct_ptr = (void *)local_238._8_8_;
      each_max_with<double>((Omega_h *)&local_298,&local_b0,opts.floor);
      if ((local_238._0_8_ & 7) == 0 && (Alloc *)local_238._0_8_ != (Alloc *)0x0) {
        piVar4 = (int *)(local_238._0_8_ + 0x30);
        *piVar4 = *piVar4 + -1;
        if (*piVar4 == 0) {
          Alloc::~Alloc((Alloc *)local_238._0_8_);
          operator_delete((void *)local_238._0_8_,0x48);
        }
      }
      pAVar21 = local_b0.write_.shared_alloc_.alloc;
      local_238._0_8_ = local_298._M_dataplus._M_p;
      local_238._8_8_ = local_298._M_string_length;
      if ((((ulong)local_298._M_dataplus._M_p & 7) == 0 &&
           (Alloc *)local_298._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        *(int *)(local_298._M_dataplus._M_p + 0x30) =
             *(int *)(local_298._M_dataplus._M_p + 0x30) + -1;
        local_238._0_8_ = *(long *)local_298._M_dataplus._M_p * 8 + 1;
      }
      local_298._M_dataplus._M_p = (pointer)0x0;
      local_298._M_string_length = 0;
      if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar4 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
        *piVar4 = *piVar4 + -1;
        if (*piVar4 == 0) {
          Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
          operator_delete(pAVar21,0x48);
        }
      }
      local_c0.write_.shared_alloc_.alloc = (quantity_integrals->write_).shared_alloc_.alloc;
      if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_c0.write_.shared_alloc_.alloc =
               (Alloc *)((local_c0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_c0.write_.shared_alloc_.alloc)->use_count =
               (local_c0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_c0.write_.shared_alloc_.direct_ptr =
           (quantity_integrals->write_).shared_alloc_.direct_ptr;
      local_d0.write_.shared_alloc_.alloc = (Alloc *)local_238._0_8_;
      if ((local_238._0_8_ & 7) == 0 && (Alloc *)local_238._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_d0.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_238._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_238._0_8_ + 0x30) = *(int *)(local_238._0_8_ + 0x30) + 1;
        }
      }
      local_d0.write_.shared_alloc_.direct_ptr = (void *)local_238._8_8_;
      local_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0;
      divide_each_maybe_zero((Omega_h *)local_180._M_pi,&local_c0,&local_d0);
      pAVar21 = local_d0.write_.shared_alloc_.alloc;
      if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar4 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
        *piVar4 = *piVar4 + -1;
        if (*piVar4 == 0) {
          Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
          operator_delete(pAVar21,0x48);
        }
      }
      pAVar21 = local_c0.write_.shared_alloc_.alloc;
      if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar4 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
        *piVar4 = *piVar4 + -1;
        if (*piVar4 == 0) {
          Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
          operator_delete(pAVar21,0x48);
        }
      }
      local_1d0._48_8_ = (error_integrals->write_).shared_alloc_.alloc;
      if ((local_1d0._48_8_ & 7) == 0 && (Alloc *)local_1d0._48_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1d0._48_8_ = ((Alloc *)local_1d0._48_8_)->size * 8 + 1;
        }
        else {
          ((Alloc *)local_1d0._48_8_)->use_count = ((Alloc *)local_1d0._48_8_)->use_count + 1;
        }
      }
      local_198 = (element_type *)(error_integrals->write_).shared_alloc_.direct_ptr;
      local_190._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           error_integrals[1].write_.shared_alloc_.alloc;
      if (((ulong)local_190._M_pi & 7) == 0 && (Alloc *)local_190._M_pi != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_190._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((Alloc *)local_190._M_pi)->size * 8 + 1);
        }
        else {
          ((Alloc *)local_190._M_pi)->use_count = ((Alloc *)local_190._M_pi)->use_count + 1;
        }
      }
      local_188 = (element_type *)error_integrals[1].write_.shared_alloc_.direct_ptr;
      local_248 = (Comm *)local_1f0._0_8_;
      if ((local_1f0._0_8_ & 7) == 0 && (Comm *)local_1f0._0_8_ != (Comm *)0x0) {
        if (entering_parallel == '\x01') {
          local_248 = (Comm *)((long)*(Library **)local_1f0._0_8_ * 8 + 1);
        }
        else {
          ppvVar3 = &(((HostRead<int> *)(local_1f0._0_8_ + 0x28))->read_).write_.shared_alloc_.
                     direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
        }
      }
      pCVar27 = local_248;
      peStack_240 = (element_type *)local_1f0._8_8_;
      local_1d0._32_8_ = local_238._0_8_;
      if ((local_238._0_8_ & 7) == 0 && (Alloc *)local_238._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1d0._32_8_ = *(size_t *)local_238._0_8_ * 8 + 1;
        }
        else {
          *(int *)(local_238._0_8_ + 0x30) = *(int *)(local_238._0_8_ + 0x30) + 1;
        }
      }
      local_1d0._40_8_ = local_238._8_8_;
      local_1f8 = (shared_ptr<const_Omega_h::TagBase> *)opts.tolerance;
      Mesh::comm((Mesh *)local_1d0._24_8_);
      iVar24 = 0;
      local_200 = (shared_ptr<const_Omega_h::TagBase> *)quantity_integrals;
      while( true ) {
        _Var10._M_pi = local_210.
                       super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        local_e0 = pCVar27;
        if (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
            local_e0 = local_248;
          }
          else {
            (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        if (((ulong)local_e0 & 7) == 0 && local_e0 != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_e0 = (Comm *)((long)local_e0->library_ * 8 + 1);
          }
          else {
            ppvVar3 = &(local_e0->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
          }
        }
        pCVar27 = local_e0;
        local_d8 = peStack_240;
        local_278._0_8_ =
             local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_278._8_8_ =
             local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        bVar28 = local_e0 != (Comm *)0x0;
        bVar29 = ((ulong)local_e0 & 7) == 0;
        local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_e0;
        if (bVar29 && bVar28) {
          if (entering_parallel == '\x01') {
            local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)((long)local_e0->library_ * 8 + 1);
          }
          else {
            ppvVar3 = &(local_e0->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
          }
        }
        local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_240;
        fabs_each((Omega_h *)&local_228,(Read<double> *)&local_258);
        each_leq_to<double>((Omega_h *)&local_1e0,(Read<double> *)&local_228,(double)local_1f8);
        cVar15 = get_min<signed_char>((CommPtr *)local_278,(Read<signed_char> *)&local_1e0);
        _Var12._M_pi = local_1e0._M_pi;
        if (((ulong)local_1e0._M_pi & 7) == 0 && (Alloc *)local_1e0._M_pi != (Alloc *)0x0) {
          p_Var25 = local_1e0._M_pi + 3;
          *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc((Alloc *)local_1e0._M_pi);
            operator_delete(_Var12._M_pi,0x48);
          }
        }
        pAVar21 = local_228.shared_alloc_.alloc;
        if (((ulong)local_228.shared_alloc_.alloc & 7) == 0 &&
            local_228.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar4 = &(local_228.shared_alloc_.alloc)->use_count;
          *piVar4 = *piVar4 + -1;
          if (*piVar4 == 0) {
            Alloc::~Alloc(local_228.shared_alloc_.alloc);
            operator_delete(pAVar21,0x48);
          }
        }
        peVar8 = local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((ulong)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          ppvVar3 = &(((HostRead<int> *)
                      &(local_258.
                        super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
          if (*(int *)ppvVar3 == 0) {
            Alloc::~Alloc((Alloc *)local_258.
                                   super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
            operator_delete(peVar8,0x48);
          }
        }
        if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        if (bVar29 && bVar28) {
          ppvVar3 = &(pCVar27->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
          if (*(int *)ppvVar3 == 0) {
            Alloc::~Alloc((Alloc *)pCVar27);
            operator_delete(pCVar27,0x48);
          }
        }
        if (_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi);
        }
        pCVar27 = local_248;
        if (cVar15 != '\0') break;
        local_298._M_dataplus._M_p = (pointer)local_1d0._48_8_;
        if ((local_1d0._48_8_ & 7) == 0 && (Alloc *)local_1d0._48_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_298._M_dataplus._M_p = (pointer)((long)*(_func_int ***)local_1d0._48_8_ * 8 + 1);
          }
          else {
            *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1d0._48_8_ + 0x30))->
                     _vptr__Sp_counted_base =
                 *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1d0._48_8_ + 0x30)
                          )->_vptr__Sp_counted_base + 1;
          }
        }
        _Var6._M_p = local_298._M_dataplus._M_p;
        local_298._M_string_length = (size_type)local_198;
        local_298.field_2._M_allocated_capacity = (size_type)local_190._M_pi;
        local_1d0._16_4_ = iVar24;
        if (((ulong)local_190._M_pi & 7) == 0 && (Alloc *)local_190._M_pi != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_298.field_2._M_allocated_capacity =
                 (long)(local_190._M_pi)->_vptr__Sp_counted_base * 8 + 1;
          }
          else {
            *(int *)&local_190._M_pi[3]._vptr__Sp_counted_base =
                 *(int *)&local_190._M_pi[3]._vptr__Sp_counted_base + 1;
          }
        }
        uVar7 = local_298.field_2._M_allocated_capacity;
        local_298.field_2._8_8_ = local_188;
        local_60.write_.shared_alloc_.alloc = (Alloc *)local_248;
        bVar28 = local_248 != (Comm *)0x0;
        bVar29 = ((ulong)local_248 & 7) == 0;
        if (bVar29 && bVar28) {
          if (entering_parallel == '\x01') {
            local_60.write_.shared_alloc_.alloc = (Alloc *)((long)local_248->library_ * 8 + 1);
          }
          else {
            ppvVar3 = &(local_248->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
          }
        }
        pAVar21 = local_60.write_.shared_alloc_.alloc;
        local_60.write_.shared_alloc_.direct_ptr = peStack_240;
        local_70.write_.shared_alloc_.alloc = (Alloc *)local_1d0._32_8_;
        if ((local_1d0._32_8_ & 7) == 0 && (Alloc *)local_1d0._32_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_70.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_1d0._32_8_ * 8 + 1);
          }
          else {
            *(int *)(local_1d0._32_8_ + 0x30) = *(int *)(local_1d0._32_8_ + 0x30) + 1;
          }
        }
        pAVar18 = local_70.write_.shared_alloc_.alloc;
        local_70.write_.shared_alloc_.direct_ptr = (void *)local_1d0._40_8_;
        diffuse_densities_once
                  ((Omega_h *)local_278,(Mesh *)local_1d0._24_8_,(Graph *)&local_298,&local_60,
                   &local_70);
        if (bVar29 && bVar28) {
          ppvVar3 = &(pCVar27->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
          if (*(int *)ppvVar3 == 0) {
            Alloc::~Alloc((Alloc *)pCVar27);
            operator_delete(pCVar27,0x48);
          }
        }
        local_248 = (Comm *)local_278._0_8_;
        peStack_240 = (element_type *)local_278._8_8_;
        uVar13 = local_1d0._16_4_;
        if (((local_278._0_8_ & 7) == 0 && (Comm *)local_278._0_8_ != (Comm *)0x0) &&
           (entering_parallel == '\x01')) {
          ppvVar3 = &(((HostRead<int> *)(local_278._0_8_ + 0x28))->read_).write_.shared_alloc_.
                     direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
          local_248 = (Comm *)((long)*(Library **)local_278._0_8_ * 8 + 1);
        }
        pCVar27 = local_248;
        local_278._0_8_ = (element_type *)0x0;
        local_278._8_8_ = (element_type *)0x0;
        if (((ulong)pAVar18 & 7) == 0 && pAVar18 != (Alloc *)0x0) {
          piVar4 = &pAVar18->use_count;
          *piVar4 = *piVar4 + -1;
          if (*piVar4 == 0) {
            Alloc::~Alloc(pAVar18);
            operator_delete(pAVar18,0x48);
          }
        }
        if (((ulong)pAVar21 & 7) == 0 && (Comm *)pAVar21 != (Comm *)0x0) {
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)pAVar21 + 0x30);
          *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(pAVar21);
            operator_delete(pAVar21,0x48);
          }
        }
        if ((uVar7 & 7) == 0 && (Alloc *)uVar7 != (Alloc *)0x0) {
          piVar4 = (int *)(uVar7 + 0x30);
          *piVar4 = *piVar4 + -1;
          if (*piVar4 == 0) {
            Alloc::~Alloc((Alloc *)uVar7);
            operator_delete((void *)uVar7,0x48);
          }
        }
        if (((ulong)_Var6._M_p & 7) == 0 && (Alloc *)_Var6._M_p != (Alloc *)0x0) {
          piVar4 = (int *)(_Var6._M_p + 0x30);
          *piVar4 = *piVar4 + -1;
          if (*piVar4 == 0) {
            Alloc::~Alloc((Alloc *)_Var6._M_p);
            operator_delete(_Var6._M_p,0x48);
          }
        }
        iVar24 = uVar13 + 1;
      }
      if (((char)comp_name._M_dataplus._M_p != '\0') &&
         (IVar17 = Comm::rank((Comm *)local_210.
                                      super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr), IVar17 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"diffused ",9);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             (char *)(local_168->super_Graph).a2ab.write_.shared_alloc_.alloc,
                             (long)(local_168->super_Graph).a2ab.write_.shared_alloc_.direct_ptr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," in ",4);
        poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,iVar24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," iterations\n",0xc);
      }
      psVar11 = local_200;
      peVar9 = peStack_240;
      pCVar27 = local_248;
      if ((((ulong)local_248 & 7) == 0 && local_248 != (Comm *)0x0) && (entering_parallel == '\x01')
         ) {
        ppvVar3 = &(local_248->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
        pCVar27 = (Comm *)((long)local_248->library_ * 8 + 1);
      }
      local_248 = (Comm *)0x0;
      peStack_240 = (element_type *)0x0;
      if (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((local_1f0._0_8_ & 7) == 0 && (Comm *)local_1f0._0_8_ != (Comm *)0x0) {
        ppvVar3 = &(((HostRead<int> *)(local_1f0._0_8_ + 0x28))->read_).write_.shared_alloc_.
                   direct_ptr;
        *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
        if (*(int *)ppvVar3 == 0) {
          Alloc::~Alloc((Alloc *)local_1f0._0_8_);
          operator_delete((void *)local_1f0._0_8_,0x48);
        }
      }
      _Var10._M_pi = local_170._M_pi;
      uVar7 = local_1d0._32_8_;
      local_1f0._8_8_ = peVar9;
      local_1f0._0_8_ = pCVar27;
      if ((((ulong)pCVar27 & 7) == 0 && pCVar27 != (Comm *)0x0) && (entering_parallel == '\x01')) {
        ppvVar3 = &(pCVar27->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
        local_1f0._0_8_ = (long)pCVar27->library_ * 8 + 1;
      }
      if ((local_1d0._32_8_ & 7) == 0 && (Alloc *)local_1d0._32_8_ != (Alloc *)0x0) {
        piVar4 = (int *)(local_1d0._32_8_ + 0x30);
        *piVar4 = *piVar4 + -1;
        if (*piVar4 == 0) {
          Alloc::~Alloc((Alloc *)local_1d0._32_8_);
          operator_delete((void *)uVar7,0x48);
        }
      }
      _Var12._M_pi = local_190._M_pi;
      if (((ulong)local_190._M_pi & 7) == 0 && (Alloc *)local_190._M_pi != (Alloc *)0x0) {
        p_Var25 = local_190._M_pi + 3;
        *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_190._M_pi);
          operator_delete(_Var12._M_pi,0x48);
        }
      }
      uVar7 = local_1d0._48_8_;
      if ((local_1d0._48_8_ & 7) == 0 && (Alloc *)local_1d0._48_8_ != (Alloc *)0x0) {
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1d0._48_8_ + 0x30);
        *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_1d0._48_8_);
          operator_delete((void *)uVar7,0x48);
        }
      }
      local_150.write_.shared_alloc_.alloc = (Alloc *)local_1f0._0_8_;
      if ((local_1f0._0_8_ & 7) == 0 && (Comm *)local_1f0._0_8_ != (Comm *)0x0) {
        if (entering_parallel == '\x01') {
          local_150.write_.shared_alloc_.alloc =
               (Alloc *)((long)*(Library **)local_1f0._0_8_ * 8 + 1);
        }
        else {
          ppvVar3 = &(((HostRead<int> *)(local_1f0._0_8_ + 0x28))->read_).write_.shared_alloc_.
                     direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
        }
      }
      local_150.write_.shared_alloc_.direct_ptr = (void *)local_1f0._8_8_;
      local_160.write_.shared_alloc_.alloc = (Alloc *)local_238._0_8_;
      if ((local_238._0_8_ & 7) == 0 && (Alloc *)local_238._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_160.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_238._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_238._0_8_ + 0x30) = *(int *)(local_238._0_8_ + 0x30) + 1;
        }
      }
      local_160.write_.shared_alloc_.direct_ptr = (void *)local_238._8_8_;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
      multiply_each<double>((Omega_h *)&local_50,&local_150,&local_160,&local_298);
      Read<double>::Read((Read<signed_char> *)local_278,&local_50);
      pAVar21 = ((SharedAlloc *)
                &(psVar11->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->alloc;
      uVar23 = extraout_RDX_01;
      if (((ulong)pAVar21 & 7) == 0 && pAVar21 != (Alloc *)0x0) {
        piVar4 = &pAVar21->use_count;
        *piVar4 = *piVar4 + -1;
        if (*piVar4 == 0) {
          Alloc::~Alloc(pAVar21);
          operator_delete(pAVar21,0x48);
          uVar23 = extraout_RDX_02;
        }
      }
      ((SharedAlloc *)
      &(psVar11->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      alloc = (Alloc *)local_278._0_8_;
      (psVar11->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_;
      uVar23 = uVar23 & 0xffffffffffffff00;
      if (((local_278._0_8_ & 7) == 0 && (Comm *)local_278._0_8_ != (Comm *)0x0) &&
         (entering_parallel == '\x01')) {
        ppvVar3 = &(((HostRead<int> *)(local_278._0_8_ + 0x28))->read_).write_.shared_alloc_.
                   direct_ptr;
        *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
        ((SharedAlloc *)
        &(psVar11->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        alloc = (Alloc *)((long)*(Library **)local_278._0_8_ * 8 + 1);
      }
      local_278._0_8_ = (element_type *)0x0;
      local_278._8_8_ = (element_type *)0x0;
      if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 &&
          local_50.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_50.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_50.shared_alloc_.alloc);
          operator_delete(local_50.shared_alloc_.alloc,0x48);
          uVar23 = extraout_RDX_03;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        (ulong)(local_298.field_2._M_allocated_capacity + 1));
        uVar23 = extraout_RDX_04;
      }
      pAVar21 = local_160.write_.shared_alloc_.alloc;
      if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
          local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_160.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_160.write_.shared_alloc_.alloc);
          operator_delete(pAVar21,0x48);
          uVar23 = extraout_RDX_05;
        }
      }
      pAVar21 = local_150.write_.shared_alloc_.alloc;
      if (((ulong)local_150.write_.shared_alloc_.alloc & 7) == 0 &&
          (Comm *)local_150.write_.shared_alloc_.alloc != (Comm *)0x0) {
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_150.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_150.write_.shared_alloc_.alloc);
          operator_delete(pAVar21,0x48);
          uVar23 = extraout_RDX_06;
        }
      }
      uVar7 = local_1f0._0_8_;
      pAVar21 = ((SharedAlloc *)
                &(psVar11->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->alloc;
      (_Var10._M_pi)->_vptr__Sp_counted_base = (_func_int **)pAVar21;
      (((CommPtr *)&(_Var10._M_pi)->_M_use_count)->
      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)
           (psVar11->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      bVar28 = ((ulong)pAVar21 & 7) != 0;
      error_integrals = (Reals *)CONCAT71((int7)(uVar23 >> 8),bVar28 || pAVar21 == (Alloc *)0x0);
      if ((!bVar28 && pAVar21 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        pAVar21->use_count = pAVar21->use_count + -1;
        pAVar21 = (Alloc *)(pAVar21->size * 8 + 1);
        (_Var10._M_pi)->_vptr__Sp_counted_base = (_func_int **)pAVar21;
      }
      ((SharedAlloc *)
      &(psVar11->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      alloc = (Alloc *)0x0;
      (psVar11->super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar22 = (undefined7)((ulong)pAVar21 >> 8);
      pAVar21 = (Alloc *)local_238._0_8_;
      if ((local_1f0._0_8_ & 7) == 0 && (Comm *)local_1f0._0_8_ != (Comm *)0x0) {
        ppvVar3 = &(((HostRead<int> *)(local_1f0._0_8_ + 0x28))->read_).write_.shared_alloc_.
                   direct_ptr;
        *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
        if (*(int *)ppvVar3 == 0) {
          Alloc::~Alloc((Alloc *)local_1f0._0_8_);
          operator_delete((void *)uVar7,0x48);
          error_integrals = extraout_RDX_07;
          pAVar21 = (Alloc *)local_238._0_8_;
          uVar22 = extraout_var_00;
        }
      }
    }
    else {
      pAVar21 = (quantity_integrals->write_).shared_alloc_.alloc;
      if (((ulong)pAVar21 & 1) == 0) {
        sVar26 = pAVar21->size;
      }
      else {
        sVar26 = (ulong)pAVar21 >> 3;
      }
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
      Write<double>::Write(&local_228,(LO)(sVar26 >> 3),&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        (ulong)(local_298.field_2._M_allocated_capacity + 1));
      }
      __val = 0;
      local_1f8 = &local_258;
      local_200 = &local_210;
      local_1d0._16_8_ = error_integrals;
      do {
        local_f0.write_.shared_alloc_.alloc = (quantity_integrals->write_).shared_alloc_.alloc;
        if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_f0.write_.shared_alloc_.alloc =
                 (Alloc *)((local_f0.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_f0.write_.shared_alloc_.alloc)->use_count =
                 (local_f0.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_f0.write_.shared_alloc_.direct_ptr =
             (quantity_integrals->write_).shared_alloc_.direct_ptr;
        get_component<double>((Omega_h *)&local_258,&local_f0,ncomps,__val);
        pAVar21 = local_f0.write_.shared_alloc_.alloc;
        if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
            local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_f0.write_.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(local_f0.write_.shared_alloc_.alloc);
            operator_delete(pAVar21,0x48);
          }
        }
        local_100.write_.shared_alloc_.alloc = (Alloc *)(name->_M_dataplus)._M_p;
        if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
            local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_100.write_.shared_alloc_.alloc =
                 (Alloc *)((local_100.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_100.write_.shared_alloc_.alloc)->use_count =
                 (local_100.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_100.write_.shared_alloc_.direct_ptr = (void *)name->_M_string_length;
        get_component<double>((Omega_h *)&local_210,&local_100,ncomps,__val);
        pAVar21 = local_100.write_.shared_alloc_.alloc;
        if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
            local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_100.write_.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(local_100.write_.shared_alloc_.alloc);
            operator_delete(pAVar21,0x48);
          }
        }
        local_278._0_8_ = local_278 + 0x10;
        pAVar21 = (local_168->super_Graph).a2ab.write_.shared_alloc_.alloc;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,pAVar21,
                   (long)(local_168->super_Graph).a2ab.write_.shared_alloc_.direct_ptr +
                   (long)pAVar21);
        std::__cxx11::string::append((char *)local_278);
        __len = 1;
        if (9 < __val) {
          uVar23 = (ulong)__val;
          uVar14 = 4;
          do {
            __len = uVar14;
            uVar16 = (uint)uVar23;
            if (uVar16 < 100) {
              __len = __len - 2;
              goto LAB_00285c61;
            }
            if (uVar16 < 1000) {
              __len = __len - 1;
              goto LAB_00285c61;
            }
            if (uVar16 < 10000) goto LAB_00285c61;
            uVar23 = uVar23 / 10000;
            uVar14 = __len + 4;
          } while (99999 < uVar16);
          __len = __len + 1;
        }
LAB_00285c61:
        local_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0;
        std::__cxx11::string::_M_construct((ulong)&local_1e0,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e0._M_pi,__len,__val);
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if ((Comm *)local_278._0_8_ != (Comm *)(local_278 + 0x10)) {
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._16_8_;
        }
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)(Library **)local_278._8_8_ + (long)&local_1d8->super_Graph);
        if (p_Var25 < p_Var2) {
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if ((Alloc *)local_1e0._M_pi != (Alloc *)local_1d0) {
            p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._0_8_;
          }
          if (p_Var25 < p_Var2) goto LAB_00285cf4;
          puVar19 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,local_278._0_8_);
        }
        else {
LAB_00285cf4:
          puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_278,(ulong)local_1e0._M_pi);
        }
        plVar1 = puVar19 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar1) {
          local_298.field_2._M_allocated_capacity = *plVar1;
          local_298.field_2._8_8_ = puVar19[3];
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        }
        else {
          local_298.field_2._M_allocated_capacity = *plVar1;
          local_298._M_dataplus._M_p = (pointer)*puVar19;
        }
        local_298._M_string_length = puVar19[1];
        *puVar19 = plVar1;
        puVar19[1] = 0;
        *(undefined1 *)plVar1 = 0;
        if ((Alloc *)local_1e0._M_pi != (Alloc *)local_1d0) {
          operator_delete(local_1e0._M_pi,(ulong)((long)(_func_int ***)local_1d0._0_8_ + 1));
        }
        if ((Comm *)local_278._0_8_ != (Comm *)(local_278 + 0x10)) {
          operator_delete((void *)local_278._0_8_,(ulong)((long)(_func_int ***)local_278._16_8_ + 1)
                         );
        }
        local_a0.field_2._M_allocated_capacity =
             (size_type)
             (((Write<double> *)
              &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_integrals)->
               _vptr__Sp_counted_base)->shared_alloc_).alloc;
        if ((local_a0.field_2._M_allocated_capacity & 7) == 0 &&
            (Alloc *)local_a0.field_2._M_allocated_capacity != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_a0.field_2._M_allocated_capacity =
                 ((Alloc *)local_a0.field_2._M_allocated_capacity)->size * 8 + 1;
          }
          else {
            ((Alloc *)local_a0.field_2._M_allocated_capacity)->use_count =
                 ((Alloc *)local_a0.field_2._M_allocated_capacity)->use_count + 1;
          }
        }
        local_a0.field_2._8_8_ =
             *(undefined8 *)
              &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_integrals)->_M_use_count;
        local_80 = (((Write<double> *)
                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_integrals)[1].
                     _vptr__Sp_counted_base)->shared_alloc_).alloc;
        if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_80 = (Alloc *)(local_80->size * 8 + 1);
          }
          else {
            local_80->use_count = local_80->use_count + 1;
          }
        }
        local_78 = *(Alloc **)
                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_integrals)[1].
                     _M_use_count;
        local_110.write_.shared_alloc_.alloc =
             (Alloc *)local_258.
                      super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (((ulong)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_110.write_.shared_alloc_.alloc =
                 (Alloc *)((long)(local_258.
                                  super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_TagBase * 8 + 1);
          }
          else {
            ppvVar3 = &(((HostRead<int> *)
                        &(local_258.
                          super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
          }
        }
        local_110.write_.shared_alloc_.direct_ptr =
             local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_a0._M_dataplus._M_p =
             (pointer)local_210.
                      super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (((ulong)local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_a0._M_dataplus._M_p =
                 (pointer)((long)(local_210.
                                  super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_TagBase * 8 + 1);
          }
          else {
            ppvVar3 = &(((HostRead<int> *)
                        &(local_210.
                          super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
          }
        }
        _Var6._M_p = local_a0._M_dataplus._M_p;
        local_a0._M_string_length =
             (size_type)
             local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        diffuse_integrals_weighted
                  ((Mesh *)local_278,(Graph *)local_1d0._24_8_,(Reals *)&local_a0.field_2,&local_110
                   ,opts,&local_a0,SUB81(&local_298,0));
        peVar8 = local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((ulong)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          ppvVar3 = &(((HostRead<int> *)
                      &(local_258.
                        super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
          if (*(int *)ppvVar3 == 0) {
            Alloc::~Alloc((Alloc *)local_258.
                                   super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
            operator_delete(peVar8,0x48);
          }
        }
        local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_278._0_8_;
        local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_;
        if (((local_278._0_8_ & 7) == 0 && (Comm *)local_278._0_8_ != (Comm *)0x0) &&
           (entering_parallel == '\x01')) {
          ppvVar3 = &(((HostRead<int> *)(local_278._0_8_ + 0x28))->read_).write_.shared_alloc_.
                     direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
          local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)((long)*(Library **)local_278._0_8_ * 8 + 1);
        }
        local_278._0_8_ = (element_type *)0x0;
        local_278._8_8_ = (element_type *)0x0;
        if (((ulong)_Var6._M_p & 7) == 0 && (Comm *)_Var6._M_p != (Comm *)0x0) {
          ppvVar3 = (void **)(_Var6._M_p + 0x30);
          *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
          if (*(int *)ppvVar3 == 0) {
            Alloc::~Alloc((Alloc *)_Var6._M_p);
            operator_delete(_Var6._M_p,0x48);
          }
        }
        pAVar21 = local_110.write_.shared_alloc_.alloc;
        error_integrals = (Reals *)local_1d0._16_8_;
        if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
            (Comm *)local_110.write_.shared_alloc_.alloc != (Comm *)0x0) {
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_110.write_.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(pAVar21);
            operator_delete(pAVar21,0x48);
          }
        }
        pAVar21 = local_80;
        if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
          piVar4 = &local_80->use_count;
          *piVar4 = *piVar4 + -1;
          if (*piVar4 == 0) {
            Alloc::~Alloc(local_80);
            operator_delete(pAVar21,0x48);
          }
        }
        uVar7 = local_a0.field_2._M_allocated_capacity;
        if ((local_a0.field_2._M_allocated_capacity & 7) == 0 &&
            (Alloc *)local_a0.field_2._M_allocated_capacity != (Alloc *)0x0) {
          piVar4 = (int *)(local_a0.field_2._M_allocated_capacity + 0x30);
          *piVar4 = *piVar4 + -1;
          if (*piVar4 == 0) {
            Alloc::~Alloc((Alloc *)local_a0.field_2._M_allocated_capacity);
            operator_delete((void *)uVar7,0x48);
          }
        }
        local_120.shared_alloc_.alloc = local_228.shared_alloc_.alloc;
        if (((ulong)local_228.shared_alloc_.alloc & 7) == 0 &&
            local_228.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_120.shared_alloc_.alloc = (Alloc *)((local_228.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_228.shared_alloc_.alloc)->use_count =
                 (local_228.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_120.shared_alloc_.direct_ptr = local_228.shared_alloc_.direct_ptr;
        local_130.write_.shared_alloc_.alloc =
             (Alloc *)local_258.
                      super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (((ulong)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          if (entering_parallel == '\x01') {
            local_130.write_.shared_alloc_.alloc =
                 (Alloc *)((long)(local_258.
                                  super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_TagBase * 8 + 1);
          }
          else {
            ppvVar3 = &(((HostRead<int> *)
                        &(local_258.
                          super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
            *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
          }
        }
        local_130.write_.shared_alloc_.direct_ptr =
             local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        set_component<double>(&local_120,&local_130,ncomps,__val);
        pAVar21 = local_130.write_.shared_alloc_.alloc;
        if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
            (Comm *)local_130.write_.shared_alloc_.alloc != (Comm *)0x0) {
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_130.write_.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(pAVar21);
            operator_delete(pAVar21,0x48);
          }
        }
        pAVar21 = local_120.shared_alloc_.alloc;
        if (((ulong)local_120.shared_alloc_.alloc & 7) == 0 &&
            local_120.shared_alloc_.alloc != (Alloc *)0x0) {
          p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_120.shared_alloc_.alloc + 0x30);
          *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc(local_120.shared_alloc_.alloc);
            operator_delete(pAVar21,0x48);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,
                          (ulong)(local_298.field_2._M_allocated_capacity + 1));
        }
        peVar8 = local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((ulong)local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_210.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          ppvVar3 = &(((HostRead<int> *)
                      &(local_210.
                        super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
          if (*(int *)ppvVar3 == 0) {
            Alloc::~Alloc((Alloc *)local_210.
                                   super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
            operator_delete(peVar8,0x48);
          }
        }
        peVar8 = local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((ulong)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr & 7) == 0 &&
            (Comm *)local_258.super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Comm *)0x0) {
          ppvVar3 = &(((HostRead<int> *)
                      &(local_258.
                        super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->ncomps_)->read_).write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
          if (*(int *)ppvVar3 == 0) {
            Alloc::~Alloc((Alloc *)local_258.
                                   super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
            operator_delete(peVar8,0x48);
          }
        }
        __val = __val + 1;
      } while (__val != ncomps);
      local_140.shared_alloc_.alloc = local_228.shared_alloc_.alloc;
      local_140.shared_alloc_.direct_ptr = local_228.shared_alloc_.direct_ptr;
      if ((((ulong)local_228.shared_alloc_.alloc & 7) == 0 &&
           local_228.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_228.shared_alloc_.alloc)->use_count = (local_228.shared_alloc_.alloc)->use_count + -1
        ;
        local_140.shared_alloc_.alloc = (Alloc *)((local_228.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_228.shared_alloc_.alloc = (Alloc *)0x0;
      local_228.shared_alloc_.direct_ptr = (element_type *)0x0;
      Read<double>::Read((Read<signed_char> *)local_170._M_pi,&local_140);
      pAVar18 = local_140.shared_alloc_.alloc;
      uVar22 = (undefined7)((ulong)extraout_RAX >> 8);
      error_integrals = extraout_RDX;
      pAVar21 = local_228.shared_alloc_.alloc;
      if (((ulong)local_140.shared_alloc_.alloc & 7) == 0 &&
          local_140.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_140.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var25->_vptr__Sp_counted_base = *(int *)&p_Var25->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var25->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_140.shared_alloc_.alloc);
          operator_delete(pAVar18,0x48);
          error_integrals = extraout_RDX_00;
          pAVar21 = local_228.shared_alloc_.alloc;
          uVar22 = extraout_var;
        }
      }
    }
    pAVar18 = (Alloc *)CONCAT71(uVar22,pAVar21 == (Alloc *)0x0);
    if (((ulong)pAVar21 & 7) == 0 && pAVar21 != (Alloc *)0x0) {
      piVar4 = &pAVar21->use_count;
      *piVar4 = *piVar4 + -1;
      if (*piVar4 == 0) {
        Alloc::~Alloc(pAVar21);
        operator_delete(pAVar21,0x48);
        pAVar18 = extraout_RAX_00;
        error_integrals = extraout_RDX_08;
      }
    }
  }
  RVar30.write_.shared_alloc_.direct_ptr = error_integrals;
  RVar30.write_.shared_alloc_.alloc = pAVar18;
  return (Reals)RVar30.write_.shared_alloc_;
}

Assistant:

static Reals diffuse_integrals_weighted(Mesh* mesh, Graph g,
    Reals error_integrals, Reals quantity_integrals, VarCompareOpts opts,
    std::string const& name, bool verbose) {
  if (opts.type == VarCompareOpts::NONE) return error_integrals;
  auto ncomps = divide_no_remainder(error_integrals.size(), g.nnodes());
  if (ncomps > 1) {
    Write<Real> out(error_integrals.size());
    for (Int c = 0; c < ncomps; ++c) {
      auto comp_integrals = get_component(error_integrals, ncomps, c);
      auto comp_quantity_integrals =
          get_component(quantity_integrals, ncomps, c);
      auto comp_name = name + "_" + std::to_string(c);
      comp_integrals = diffuse_integrals_weighted(mesh, g, comp_integrals,
          comp_quantity_integrals, opts, comp_name, verbose);
      set_component(out, comp_integrals, ncomps, c);
    }
    return out;
  }
  auto weighted_sizes = fabs_each(quantity_integrals);
  weighted_sizes = each_max_with(weighted_sizes, opts.floor);
  auto weighted_densities =
      divide_each_maybe_zero(error_integrals, weighted_sizes);
  weighted_densities = diffuse_densities(
      mesh, g, weighted_densities, weighted_sizes, opts, name, verbose);
  error_integrals = multiply_each(weighted_densities, weighted_sizes);
  return error_integrals;
}